

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)

{
  byte bVar1;
  uint uVar2;
  int volume_1;
  int volume;
  UINT8 c;
  ADPCM_CH *adpcm;
  int v_local;
  int r_local;
  YM2610 *F2610_local;
  
  F2610->adpcmreg[r] = v & 0xff;
  if (r == 0) {
    if ((v & 0x80U) == 0) {
      for (volume_1._3_1_ = 0; volume_1._3_1_ < 6; volume_1._3_1_ = volume_1._3_1_ + 1) {
        if ((v >> (volume_1._3_1_ & 0x1f) & 1U) != 0) {
          F2610->adpcm[volume_1._3_1_].now_addr = F2610->adpcm[volume_1._3_1_].start << 1;
          F2610->adpcm[volume_1._3_1_].now_step = 0;
          F2610->adpcm[volume_1._3_1_].adpcm_acc = 0;
          F2610->adpcm[volume_1._3_1_].adpcm_step = 0;
          F2610->adpcm[volume_1._3_1_].adpcm_out = 0;
          F2610->adpcm[volume_1._3_1_].flag = '\x01';
          if (F2610->pcmbuf == (UINT8 *)0x0) {
            emu_logf(&(F2610->OPN).logger,'\x02',"ADPCM-A rom not mapped\n");
            F2610->adpcm[volume_1._3_1_].flag = '\0';
          }
          else {
            if (F2610->pcm_size <= F2610->adpcm[volume_1._3_1_].end) {
              emu_logf(&(F2610->OPN).logger,'\x04',"ADPCM-A end out of range: $%08x\n",
                       (ulong)F2610->adpcm[volume_1._3_1_].end);
            }
            if (F2610->pcm_size <= F2610->adpcm[volume_1._3_1_].start) {
              emu_logf(&(F2610->OPN).logger,'\x04',"ADPCM-A start out of range: $%08x\n",
                       (ulong)F2610->adpcm[volume_1._3_1_].start);
              F2610->adpcm[volume_1._3_1_].flag = '\0';
            }
          }
        }
      }
    }
    else {
      for (volume_1._3_1_ = 0; volume_1._3_1_ < 6; volume_1._3_1_ = volume_1._3_1_ + 1) {
        if ((v >> (volume_1._3_1_ & 0x1f) & 1U) != 0) {
          F2610->adpcm[volume_1._3_1_].flag = '\0';
        }
      }
    }
  }
  else if (r == 1) {
    F2610->adpcmTL = (byte)v & 0x3f ^ 0x3f;
    for (volume_1._3_1_ = 0; volume_1._3_1_ < 6; volume_1._3_1_ = volume_1._3_1_ + 1) {
      uVar2 = (uint)F2610->adpcmTL + (uint)F2610->adpcm[volume_1._3_1_].IL;
      if (uVar2 < 0x3f) {
        F2610->adpcm[volume_1._3_1_].vol_mul = '\x0f' - ((byte)uVar2 & 7);
        F2610->adpcm[volume_1._3_1_].vol_shift = (char)((int)uVar2 >> 3) + '\x01';
      }
      else {
        F2610->adpcm[volume_1._3_1_].vol_mul = '\0';
        F2610->adpcm[volume_1._3_1_].vol_shift = '\0';
      }
      F2610->adpcm[volume_1._3_1_].adpcm_out =
           F2610->adpcm[volume_1._3_1_].adpcm_acc * (int)F2610->adpcm[volume_1._3_1_].vol_mul >>
           (F2610->adpcm[volume_1._3_1_].vol_shift & 0x1f) & 0xfffffffc;
    }
  }
  else {
    bVar1 = (byte)r & 7;
    if (bVar1 < 6) {
      switch(r & 0x38) {
      case 8:
        F2610->adpcm[bVar1].IL = (byte)v & 0x1f ^ 0x1f;
        uVar2 = (uint)F2610->adpcmTL + (uint)F2610->adpcm[bVar1].IL;
        if (uVar2 < 0x3f) {
          F2610->adpcm[bVar1].vol_mul = '\x0f' - ((byte)uVar2 & 7);
          F2610->adpcm[bVar1].vol_shift = (char)((int)uVar2 >> 3) + '\x01';
        }
        else {
          F2610->adpcm[bVar1].vol_mul = '\0';
          F2610->adpcm[bVar1].vol_shift = '\0';
        }
        F2610->adpcm[bVar1].pan = (F2610->OPN).out_adpcm + (int)(v >> 6 & 3);
        F2610->adpcm[bVar1].adpcm_out =
             F2610->adpcm[bVar1].adpcm_acc * (int)F2610->adpcm[bVar1].vol_mul >>
             (F2610->adpcm[bVar1].vol_shift & 0x1f) & 0xfffffffc;
        break;
      case 0x10:
      case 0x18:
        F2610->adpcm[bVar1].start =
             (F2610->adpcmreg[(int)(bVar1 + 0x18)] << 8 | F2610->adpcmreg[(int)(bVar1 + 0x10)]) << 8
        ;
        break;
      case 0x20:
      case 0x28:
        F2610->adpcm[bVar1].end =
             (F2610->adpcmreg[(int)(bVar1 + 0x28)] << 8 | F2610->adpcmreg[(int)(bVar1 + 0x20)]) << 8
        ;
        F2610->adpcm[bVar1].end = F2610->adpcm[bVar1].end + 0xff;
      }
    }
  }
  return;
}

Assistant:

static void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)
{
	ADPCM_CH *adpcm = F2610->adpcm;
	UINT8 c = r&0x07;

	F2610->adpcmreg[r] = v&0xff; /* stock data */
	switch( r )
	{
	case 0x00: /* DM,--,C5,C4,C3,C2,C1,C0 */
		if( !(v&0x80) )
		{
			/* KEY ON */
			for( c = 0; c < 6; c++ )
			{
				if( (v>>c)&1 )
				{
					/**** start adpcm ****/
					// The .step variable is already set and for the YM2608 it is different on channels 4 and 5.
					//adpcm[c].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2610->OPN.ST.freqbase)/3.0);
					adpcm[c].now_addr  = adpcm[c].start<<1;
					adpcm[c].now_step  = 0;
					adpcm[c].adpcm_acc = 0;
					adpcm[c].adpcm_step= 0;
					adpcm[c].adpcm_out = 0;
					adpcm[c].flag      = 1;

					if(F2610->pcmbuf==NULL)
					{                   /* Check ROM Mapped */
						emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "ADPCM-A rom not mapped\n");
						adpcm[c].flag = 0;
					}
					else
					{
						if(adpcm[c].end >= F2610->pcm_size)
						{   /* Check End in Range */
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A end out of range: $%08x\n",adpcm[c].end);
							/*adpcm[c].end = F2610->pcm_size-1;*/ /* JB: DO NOT uncomment this, otherwise you will break the comparison in the ADPCM_CALC_CHA() */
						}
						if(adpcm[c].start >= F2610->pcm_size)   /* Check Start in Range */
						{
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A start out of range: $%08x\n",adpcm[c].start);
							adpcm[c].flag = 0;
						}
					}
				}
			}
		}
		else
		{
			/* KEY OFF */
			for( c = 0; c < 6; c++ )
				if( (v>>c)&1 )
					adpcm[c].flag = 0;
		}
		break;
	case 0x01:  /* B0-5 = TL */
		F2610->adpcmTL = (v & 0x3f) ^ 0x3f;
		for( c = 0; c < 6; c++ )
		{
			int volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
		break;
	default:
		c = r&0x07;
		if( c >= 0x06 ) return;
		switch( r&0x38 )
		{
		case 0x08:  /* B7=L,B6=R, B4-0=IL */
		{
			int volume;

			adpcm[c].IL = (v & 0x1f) ^ 0x1f;

			volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			adpcm[c].pan    = &F2610->OPN.out_adpcm[(v>>6)&0x03];

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
			break;
		case 0x10:
		case 0x18:
			adpcm[c].start  = ( (F2610->adpcmreg[0x18 + c]*0x0100 | F2610->adpcmreg[0x10 + c]) << ADPCMA_ADDRESS_SHIFT);
			break;
		case 0x20:
		case 0x28:
			adpcm[c].end    = ( (F2610->adpcmreg[0x28 + c]*0x0100 | F2610->adpcmreg[0x20 + c]) << ADPCMA_ADDRESS_SHIFT);
			adpcm[c].end   += (1<<ADPCMA_ADDRESS_SHIFT) - 1;
			break;
		}
	}
}